

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  string *psVar6;
  cmValue cVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view source;
  string_view source_00;
  string incflag;
  string modflag;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_f0;
  string *local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  cmLocalCommonGenerator *local_60;
  string local_58;
  cmOutputConverter *local_38;
  
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  paVar3 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  local_d0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"CMAKE_Fortran_MODOUT_FLAG","");
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_f0);
  (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(this,local_d0,psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1));
  }
  psVar6 = GetWorkingDirectory_abi_cxx11_(this);
  cmGeneratorTarget::GetFortranModuleDirectory(&local_88,target,psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_string_length ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    local_f0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"CMAKE_Fortran_MODDIR_DEFAULT","");
    cmMakefile::GetSafeDefinition(pcVar1,&local_f0);
    std::__cxx11::string::_M_assign((string *)&local_88);
    uVar8 = local_f0.field_2._M_allocated_capacity;
    _Var9._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == paVar3) goto LAB_004ee7d7;
  }
  else {
    MaybeRelativeToWorkDir(&local_a8,this,&local_88);
    source._M_str = local_a8._M_dataplus._M_p;
    source._M_len = local_a8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_f0,&(this->super_cmLocalGenerator).super_cmOutputConverter,source,SHELL);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1))
      ;
    }
    uVar8 = local_a8.field_2._M_allocated_capacity;
    _Var9._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_004ee7d7;
  }
  operator_delete(_Var9._M_p,(ulong)(uVar8 + 1));
LAB_004ee7d7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    paVar4 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"CMAKE_Fortran_MODDIR_FLAG","");
    psVar6 = cmMakefile::GetRequiredDefinition(pcVar1,&local_c8);
    local_f0._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
    local_f0.field_2._M_allocated_capacity = local_88._M_string_length;
    local_f0.field_2._8_8_ = local_88._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_f0;
    cmCatViews_abi_cxx11_(&local_a8,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar4) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(this,local_d0,&local_a8);
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    local_f0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"CMAKE_Fortran_MODDIR_INCLUDE_FLAG","");
    psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_f0);
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,pcVar2 + psVar6->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_f0._M_dataplus._M_p = (pointer)local_c8._M_string_length;
      local_f0._M_string_length = (size_type)local_c8._M_dataplus._M_p;
      local_f0.field_2._M_allocated_capacity = local_88._M_string_length;
      local_f0.field_2._8_8_ = local_88._M_dataplus._M_p;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_f0;
      cmCatViews_abi_cxx11_(&local_58,views_00);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(this,local_d0,&local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar4) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"CMAKE_Fortran_MODPATH_FLAG","");
  cVar7 = cmMakefile::GetDefinition(pcVar1,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1));
  }
  if (cVar7.Value != (string *)0x0) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    local_f0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"C","");
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_58,target,&local_f0,config);
    local_60 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1))
      ;
    }
    sVar5 = local_58._M_string_length;
    if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
      local_38 = &(local_60->super_cmLocalGenerator).super_cmOutputConverter;
      _Var9._M_p = local_58._M_dataplus._M_p;
      do {
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((cVar7.Value)->_M_dataplus)._M_p;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(cVar7.Value)->_M_string_length;
        source_00._M_str = *(char **)_Var9._M_p;
        source_00._M_len = *(size_t *)(_Var9._M_p + 8);
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_c8,local_38,source_00,SHELL);
        local_f0.field_2._M_allocated_capacity = local_c8._M_string_length;
        local_f0.field_2._8_8_ = local_c8._M_dataplus._M_p;
        views_01._M_len = 2;
        views_01._M_array = (iterator)&local_f0;
        local_f0._M_dataplus._M_p = (pointer)paVar4;
        local_f0._M_string_length = (size_type)paVar3;
        cmCatViews_abi_cxx11_(&local_a8,views_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        (*(local_60->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(local_60,local_d0,&local_a8)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          (ulong)(local_a8.field_2._M_allocated_capacity + 1));
        }
        _Var9._M_p = _Var9._M_p + 0x20;
      } while (_Var9._M_p != (pointer)sVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return local_d0;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODOUT_FLAG"));

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->GetWorkingDirectory());
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->MaybeRelativeToWorkDir(mod_dir), cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    std::string modflag = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG"),
      mod_dir);
    this->AppendFlags(flags, modflag);
    // Some compilers do not search their own module output directory
    // for using other modules.  Add an include directory explicitly
    // for consistency with compilers that do search it.
    std::string incflag =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_INCLUDE_FLAG");
    if (!incflag.empty()) {
      incflag = cmStrCat(incflag, mod_dir);
      this->AppendFlags(flags, incflag);
    }
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (cmValue modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::string const& id : includes) {
      std::string flg =
        cmStrCat(*modpath_flag,
                 this->ConvertToOutputFormat(id, cmOutputConverter::SHELL));
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}